

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O3

int coda_is_identifier(char *name)

{
  ushort **ppuVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  
  iVar3 = 0;
  if (name != (char *)0x0) {
    ppuVar1 = __ctype_b_loc();
    iVar3 = 0;
    if ((*(byte *)((long)*ppuVar1 + (long)*name * 2 + 1) & 4) != 0) {
      cVar2 = name[1];
      if (cVar2 != '\0') {
        pcVar4 = name + 2;
        do {
          if ((cVar2 != '_') && (((*ppuVar1)[cVar2] & 8) == 0)) {
            return 0;
          }
          cVar2 = *pcVar4;
          pcVar4 = pcVar4 + 1;
        } while (cVar2 != '\0');
      }
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int coda_is_identifier(const char *name)
{
    int i;

    if (name == NULL)
    {
        return 0;
    }
    if (!isalpha(*name))
    {
        return 0;
    }
    i = 1;
    while (name[i] != '\0')
    {
        if (!(isalnum(name[i]) || name[i] == '_'))
        {
            return 0;
        }
        i++;
    }
    return 1;
}